

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O1

void __thiscall
booster::locale::impl_posix::collator<char>::collator
          (collator<char> *this,shared_ptr<__locale_struct_*> *l,size_t refs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  std::__cxx11::collate<char>::collate((ulong)this);
  *(undefined ***)this = &PTR__collator_001d2670;
  (this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (l->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (l->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

collator(booster::shared_ptr<locale_t> l,size_t refs = 0) : 
        std::collate<CharType>(refs),
        lc_(l)
    {
    }